

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieparser.cpp
# Opt level: O3

void __thiscall
LottieParserImpl::parsePropertyHelper<VPointF,void>
          (LottieParserImpl *this,Property<VPointF,_void> *obj)

{
  LookaheadParsingState LVar1;
  bool bVar2;
  details obj_00;
  
  if (((this->super_LookaheadParserHandler).st_ - kHasNull < 5) &&
     (((this->super_LookaheadParserHandler).v_.data_.f.flags & 7) == 6)) {
LAB_00139ddb:
    if (obj->isValue_ != false) {
      getValue(this,(VPointF *)obj);
      return;
    }
    (this->super_LookaheadParserHandler).st_ = kError;
  }
  else {
    EnterArray(this);
    while (bVar2 = NextArrayValue(this), bVar2) {
      LVar1 = (this->super_LookaheadParserHandler).st_;
      if (LVar1 - kHasNull < 5) {
        if (((this->super_LookaheadParserHandler).v_.data_.f.flags & 7) != 3) goto LAB_00139ddb;
      }
      else if (LVar1 != kEnteringObject) goto LAB_00139ddb;
      if (obj->isValue_ == false) {
        obj_00 = obj->impl_;
      }
      else {
        obj_00 = (details)operator_new(0x18);
        *(undefined8 *)obj_00 = 0;
        *(undefined8 *)((long)obj_00 + 8) = 0;
        *(undefined8 *)((long)obj_00 + 0x10) = 0;
        obj->impl_ = obj_00;
        obj->isValue_ = false;
      }
      parseKeyFrame<VPointF,void>(this,(KeyFrames<VPointF,_void> *)obj_00);
    }
  }
  return;
}

Assistant:

void LottieParserImpl::parsePropertyHelper(model::Property<T, Tag> &obj)
{
    if (PeekType() == kNumberType) {
        if (!obj.isStatic()) {
            st_ = kError;
            return;
        }
        /*single value property with no animation*/
        getValue(obj.value());
    } else {
        EnterArray();
        while (NextArrayValue()) {
            /* property with keyframe info*/
            if (PeekType() == kObjectType) {
                parseKeyFrame(obj.animation());
            } else {
                /* Read before modifying.
                 * as there is no way of knowing if the
                 * value of the array is either array of numbers
                 * or array of object without entering the array
                 * thats why this hack is there
                 */
                if (!obj.isStatic()) {
                    st_ = kError;
                    return;
                }
                /*multi value property with no animation*/
                getValue(obj.value());
                /*break here as we already reached end of array*/
                break;
            }
        }
        obj.cache();
    }
}